

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

Storage * storage_abi_cxx11_(void)

{
  undefined8 in_RAX;
  Storage *pSVar1;
  string_type local_a8;
  string local_88;
  path local_68;
  path local_48;
  path local_28;
  
  pSVar1 = (Storage *)CONCAT71((int7)((ulong)in_RAX >> 8),storage[abi:cxx11]()::_storage_abi_cxx11_)
  ;
  if (storage[abi:cxx11]()::_storage_abi_cxx11_ == '\0') {
    pSVar1 = (Storage *)__cxa_guard_acquire(&storage[abi:cxx11]()::_storage_abi_cxx11_);
    if ((int)pSVar1 != 0) {
      relive::dataPath_abi_cxx11_();
      ghc::filesystem::path::path(&local_48,&local_a8,auto_format);
      ghc::filesystem::path::path<char[14],ghc::filesystem::path>
                (&local_68,(char (*) [14])"relive.sqlite",auto_format);
      ghc::filesystem::operator/(&local_28,&local_48,&local_68);
      ghc::filesystem::path::string_abi_cxx11_(&local_88,&local_28);
      initStorage(&storage[abi:cxx11]()::_storage_abi_cxx11_,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      ghc::filesystem::path::~path(&local_28);
      ghc::filesystem::path::~path(&local_68);
      ghc::filesystem::path::~path(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(sqlite_orm::internal::storage_t<$86c824a$>::~storage_t,
                   &storage[abi:cxx11]()::_storage_abi_cxx11_,&__dso_handle);
      pSVar1 = (Storage *)__cxa_guard_release(&storage[abi:cxx11]()::_storage_abi_cxx11_);
    }
  }
  return pSVar1;
}

Assistant:

static Storage& storage()
{
    static Storage _storage = initStorage((fs::path(dataPath()) / "relive.sqlite").string());
    return _storage;
}